

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

QColor QColorDialog::getColor
                 (QColor *initial,QWidget *parent,QString *title,ColorDialogOptions options)

{
  long lVar1;
  bool bVar2;
  QColorDialog *pQVar3;
  QWidget *in_RDX;
  long in_FS_OFFSET;
  QColor QVar4;
  QAutoPointer<QColorDialog> dlg;
  QColor *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  QColorDialog *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QColorDialog *in_stack_ffffffffffffffb8;
  undefined4 local_40;
  undefined2 uStack_3c;
  QFlagsStorage<QColorDialog::ColorDialogOption> options_00;
  undefined8 local_18;
  undefined4 local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  options_00.i = 0xaaaaaaaa;
  operator_new(0x28);
  QColorDialog(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  QAutoPointer<QColorDialog>::QAutoPointer
            ((QAutoPointer<QColorDialog> *)in_stack_ffffffffffffff80,
             (QColorDialog *)in_stack_ffffffffffffff78);
  bVar2 = QString::isEmpty((QString *)0x73a19c);
  if (!bVar2) {
    QAutoPointer<QColorDialog>::operator->((QAutoPointer<QColorDialog> *)0x73a1aa);
    QWidget::setWindowTitle
              (in_RDX,(QString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  QAutoPointer<QColorDialog>::operator->((QAutoPointer<QColorDialog> *)0x73a1c1);
  setOptions(in_stack_ffffffffffffffb8,(ColorDialogOptions)options_00.i);
  QAutoPointer<QColorDialog>::operator->((QAutoPointer<QColorDialog> *)0x73a1df);
  setCurrentColor((QColorDialog *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pQVar3 = QAutoPointer<QColorDialog>::operator->((QAutoPointer<QColorDialog> *)0x73a1f6);
  (**(code **)(*(long *)&(pQVar3->super_QDialog).super_QWidget + 0x1a8))();
  bVar2 = QAutoPointer::operator_cast_to_bool((QAutoPointer<QColorDialog> *)0x73a20c);
  if (bVar2) {
    QAutoPointer<QColorDialog>::operator->((QAutoPointer<QColorDialog> *)0x73a21c);
    QVar4 = selectedColor(in_stack_ffffffffffffff88);
    local_18 = QVar4._0_8_;
    local_40 = QVar4.ct._4_4_;
    local_10 = local_40;
    uStack_3c = QVar4.ct._8_2_;
    uStack_c = uStack_3c;
  }
  else {
    QColor::QColor((QColor *)0x73a25e);
  }
  QAutoPointer<QColorDialog>::~QAutoPointer((QAutoPointer<QColorDialog> *)in_stack_ffffffffffffff80)
  ;
  QVar4.ct.argb.pad = uStack_c;
  QVar4.ct._4_4_ = local_10;
  QVar4._14_2_ = uStack_a;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar4._0_8_ = local_18;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QColor QColorDialog::getColor(const QColor &initial, QWidget *parent, const QString &title,
                              ColorDialogOptions options)
{
    QAutoPointer<QColorDialog> dlg(new QColorDialog(parent));
    if (!title.isEmpty())
        dlg->setWindowTitle(title);
    dlg->setOptions(options);
    dlg->setCurrentColor(initial);

    // If the dlg was deleted with a parent window,
    // dlg == nullptr after leaving the exec().
    dlg->exec();
    if (bool(dlg))
        return dlg->selectedColor();
    else
        return QColor();
}